

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istream.cc
# Opt level: O0

uchar __thiscall wabt::interp::Istream::ReadAt<unsigned_char>(Istream *this,Offset *offset)

{
  uchar uVar1;
  uint uVar2;
  size_type sVar3;
  uchar *puVar4;
  uchar result;
  Offset *offset_local;
  Istream *this_local;
  
  uVar2 = *offset;
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data_);
  if ((ulong)uVar2 + 1 <= sVar3) {
    puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->data_);
    uVar1 = puVar4[*offset];
    *offset = *offset + 1;
    return uVar1;
  }
  __assert_fail("*offset + sizeof(T) <= data_.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/interp/istream.cc"
                ,0x6f,"T wabt::interp::Istream::ReadAt(Offset *) const [T = unsigned char]");
}

Assistant:

T WABT_VECTORCALL Istream::ReadAt(Offset* offset) const {
  assert(*offset + sizeof(T) <= data_.size());
  T result;
  memcpy(&result, data_.data() + *offset, sizeof(T));
  *offset += sizeof(T);
  return result;
}